

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O1

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  int iVar1;
  int _h;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  short sVar6;
  char cVar7;
  void *pvVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  ushort uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  size_t sVar18;
  uint uVar19;
  
  iVar15 = this->type_to;
  if (this->type_from == iVar15) {
    iVar17 = 0;
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar15 = bottom_blob->w;
      iVar17 = bottom_blob->h;
      iVar1 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar15;
      top_blob->h = iVar17;
      top_blob->c = iVar1;
      top_blob->cstep = bottom_blob->cstep;
      iVar17 = 0;
    }
  }
  else {
    _c = bottom_blob->c;
    iVar17 = bottom_blob->dims;
    iVar1 = bottom_blob->elempack;
    sVar18 = (size_t)iVar1;
    if (iVar15 != 3) {
      if (iVar15 == 2) {
        sVar18 = (size_t)(iVar1 * 2);
      }
      else if (iVar15 == 1) {
        sVar18 = sVar18 * 4;
      }
      else {
        sVar18 = bottom_blob->elemsize;
      }
    }
    iVar15 = bottom_blob->w;
    _h = bottom_blob->h;
    if (iVar17 == 3) {
      Mat::create(top_blob,iVar15,_h,_c,sVar18,iVar1,opt->blob_allocator);
    }
    else if (iVar17 == 2) {
      Mat::create(top_blob,iVar15,_h,sVar18,iVar1,opt->blob_allocator);
    }
    else if (iVar17 == 1) {
      Mat::create(top_blob,iVar15,sVar18,iVar1,opt->blob_allocator);
    }
    iVar17 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar9 = _h * iVar15 * iVar1;
      if (0 < (int)_c && (this->type_to == 2 && this->type_from == 1)) {
        pvVar8 = bottom_blob->data;
        sVar18 = bottom_blob->cstep;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        pvVar10 = top_blob->data;
        sVar5 = bottom_blob->elemsize;
        uVar11 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar12 = 0;
            do {
              uVar14 = *(uint *)((long)pvVar8 + uVar12 * 4);
              uVar16 = uVar14 & 0x7fffff;
              cVar7 = (char)(uVar14 >> 0x17);
              uVar13 = (ushort)(uVar14 >> 0x10);
              sVar6 = (short)uVar13 >> 0xf;
              if (cVar7 == -1) {
                uVar13 = sVar6 * -0x8000 + (ushort)(uVar16 != 0) * 0x200 + 0x7c00;
              }
              else {
                uVar14 = uVar14 >> 0x17 & 0xff;
                if (uVar14 == 0) {
LAB_00177c8a:
                  uVar13 = sVar6 * -0x8000;
                }
                else if (uVar14 < 0x8f) {
                  if (uVar14 < 0x71) {
                    if (uVar14 < 0x66) goto LAB_00177c8a;
                    uVar13 = sVar6 * -0x8000 |
                             (ushort)((uVar16 | 0x800000) >> (0x7eU - cVar7 & 0x1f));
                  }
                  else {
                    uVar13 = (ushort)(uVar16 >> 0xd) | sVar6 * -0x8000 |
                             (uVar13 >> 7) * 0x400 + 0x4000;
                  }
                }
                else {
                  uVar13 = sVar6 * -0x8000 | 0x7c00;
                }
              }
              *(ushort *)((long)pvVar10 + uVar12 * 2) = uVar13;
              uVar12 = uVar12 + 1;
            } while (uVar9 != uVar12);
          }
          uVar11 = uVar11 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar4);
          pvVar8 = (void *)((long)pvVar8 + sVar18 * sVar5);
        } while (uVar11 != _c);
      }
      if (0 < (int)_c && (this->type_to == 1 && this->type_from == 2)) {
        pvVar8 = bottom_blob->data;
        sVar18 = bottom_blob->cstep;
        sVar3 = bottom_blob->elemsize;
        pvVar10 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        uVar11 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar12 = 0;
            do {
              uVar13 = *(ushort *)((long)pvVar8 + uVar12 * 2 + sVar18 * sVar3 * uVar11);
              uVar14 = (uint)(uVar13 >> 0xf);
              uVar16 = uVar13 >> 10 & 0x1f;
              if (uVar16 == 0x1f) {
                uVar14 = (uint)uVar13 << 0xd | uVar14 << 0x1f | 0x7f800000;
              }
              else {
                uVar19 = uVar13 & 0x3ff;
                if ((uVar13 >> 10 & 0x1f) == 0) {
                  if ((short)uVar19 == 0) {
                    uVar14 = uVar14 << 0x1f;
                  }
                  else {
                    uVar16 = 0x38000000;
                    if ((uVar13 >> 9 & 1) == 0) {
                      iVar15 = 0;
                      do {
                        iVar15 = iVar15 + 1;
                        uVar16 = uVar19 >> 8;
                        uVar19 = uVar19 * 2;
                      } while ((uVar16 & 1) == 0);
                      uVar16 = iVar15 * -0x800000 + 0x38000000;
                    }
                    uVar14 = (uVar19 * 2 & 0x3fe) * 0x2000 + (uVar14 << 0x1f | uVar16);
                  }
                }
                else {
                  uVar14 = uVar19 * 0x2000 + (uVar16 << 0x17 | uVar14 << 0x1f) + 0x38000000;
                }
              }
              *(uint *)((long)pvVar10 + uVar12 * 4 + sVar4 * sVar5 * uVar11) = uVar14;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar9);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != _c);
      }
      iVar17 = 0;
    }
  }
  return iVar17;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}